

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_plus.c
# Opt level: O0

MPP_RET hal_avsd_plus_start(void *decoder,HalTaskInfo *task)

{
  uint local_4c;
  undefined8 uStack_48;
  RK_U32 i;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  AvsdHalCtx_t *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *decoder_local;
  
  p_hal._4_4_ = MPP_ERR_UNKNOW;
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","In.","hal_avsd_plus_start");
  }
  if (decoder == (void *)0x0) {
    p_hal._4_4_ = MPP_ERR_INIT;
    if ((avsd_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avsd_plus","input empty(%d).\n",(char *)0x0,0x2aa);
    }
  }
  else if (((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) ||
          (*(int *)(*(long *)((long)decoder + 0x88) + 0x30) != 0)) {
    rd_cfg._8_8_ = *(undefined8 *)((long)decoder + 0x1a0);
    if ((avsd_hal_debug & 1) != 0) {
      if (hal_avsd_plus_start::fp == (FILE *)0x0) {
        hal_avsd_plus_start::fp = (FILE *)fopen("regs.txt","w+b");
      }
      if (hal_avsd_plus_start::fp != (FILE *)0x0) {
        fprintf((FILE *)hal_avsd_plus_start::fp,"frame %d\n",(ulong)hal_avsd_plus_start::frame_no);
        for (local_4c = 0; local_4c < 0x3c; local_4c = local_4c + 1) {
          fprintf((FILE *)hal_avsd_plus_start::fp,"reg[%03d]: %08x\n",(ulong)local_4c,
                  (ulong)*(uint *)(*(long *)((long)decoder + 0x1a0) + (ulong)local_4c * 4));
        }
        hal_avsd_plus_start::frame_no = hal_avsd_plus_start::frame_no + 1;
        fflush((FILE *)hal_avsd_plus_start::fp);
      }
    }
    p_hal._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)decoder + 0x80),4,&rd_cfg.size);
    if (p_hal._4_4_ == MPP_OK) {
      uStack_48 = *(undefined8 *)((long)decoder + 0x1a0);
      rd_cfg.reg._0_4_ = 0xf0;
      rd_cfg.reg._4_4_ = 0;
      p_hal._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)decoder + 0x80),5,&stack0xffffffffffffffb8);
      if (p_hal._4_4_ == MPP_OK) {
        p_hal._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)decoder + 0x80),0xf,(void *)0x0);
        if (p_hal._4_4_ != MPP_OK) {
          _mpp_log_l(2,"hal_avsd_plus","send cmd failed %d\n","hal_avsd_plus_start",
                     (ulong)(uint)p_hal._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_avsd_plus","set register read failed %d\n","hal_avsd_plus_start",
                   (ulong)(uint)p_hal._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_avsd_plus","set register write failed %d\n","hal_avsd_plus_start",
                 (ulong)(uint)p_hal._4_4_);
    }
  }
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","Out.","hal_avsd_plus_start");
  }
  return p_hal._4_4_;
}

Assistant:

MPP_RET hal_avsd_plus_start(void *decoder, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == decoder);

    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->dec_cfg->base.disable_error) {
        goto __RETURN;
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = p_hal->p_regs;
        wr_cfg.size = AVSD_REGISTERS * sizeof(RK_U32);
        wr_cfg.offset = 0;

        if (avsd_hal_debug & AVSD_HAL_DBG_ERROR) {
            static RK_U32 frame_no = 0;
            static FILE *fp = NULL;
            RK_U32 i;

            if (!fp)
                fp = fopen("regs.txt", "w+b");

            if (fp) {
                fprintf(fp, "frame %d\n", frame_no);

                for (i = 0; i < AVSD_REGISTERS; i++)
                    fprintf(fp, "reg[%03d]: %08x\n", i, p_hal->p_regs[i]);

                frame_no++;

                fflush(fp);
            }
        }

        ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = p_hal->p_regs;
        rd_cfg.size = AVSD_REGISTERS * sizeof(RK_U32);
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

__RETURN:
    AVSD_HAL_TRACE("Out.");

    return ret;
}